

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O0

void do_find_command_for_selection_proc(Am_Object *cmd)

{
  bool bVar1;
  Am_Value *pAVar2;
  ostream *poVar3;
  void *pvVar4;
  Am_Wrapper *pAVar5;
  undefined1 local_a8 [8];
  Am_Value_List obj_mod_list;
  Am_Value obj_mod_val;
  Am_Object real_cmd;
  Am_Object this_cmd;
  Am_Value_List all_cmds;
  Am_Object local_60;
  Am_Object menu;
  Am_Value_List cmds_using_objects;
  Am_Object local_38;
  Am_Object local_30;
  Am_Object local_28;
  undefined1 local_20 [8];
  Am_Value_List objects;
  Am_Object *cmd_local;
  
  objects.item = (Am_List_Item *)cmd;
  Am_Object::Get_Object(&local_38,(Am_Slot_Key)cmd,0x170);
  Am_Object::Get_Owner(&local_30,(Am_Slot_Flags)&local_38);
  Am_Object::Get_Object(&local_28,(Am_Slot_Key)&local_30,0x197);
  pAVar2 = Am_Object::Get(&local_28,0x169,0);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_20,pAVar2);
  Am_Object::~Am_Object(&local_28);
  Am_Object::~Am_Object(&local_30);
  Am_Object::~Am_Object(&local_38);
  Am_Value_List::Am_Value_List((Am_Value_List *)&menu);
  Am_Object::Get_Object((Am_Object *)&all_cmds.item,(Am_Slot_Key)cmd,0x170);
  Am_Object::Get_Sibling(&local_60,(short)&all_cmds + 8,(ulong)Am_UNDO_SCROLL_GROUP);
  Am_Object::~Am_Object((Am_Object *)&all_cmds.item);
  pAVar2 = Am_Object::Get(&local_60,0xa2,0);
  Am_Value_List::Am_Value_List((Am_Value_List *)&this_cmd,pAVar2);
  Am_Object::Am_Object(&real_cmd);
  Am_Object::Am_Object((Am_Object *)&obj_mod_val.value);
  Am_Value::Am_Value((Am_Value *)&obj_mod_list.item);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_a8);
  if ((am_sdebug & 1U) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"selected ");
    poVar3 = operator<<(poVar3,(Am_Value_List *)local_20);
    poVar3 = std::operator<<(poVar3," all commands ");
    poVar3 = operator<<(poVar3,(Am_Value_List *)&this_cmd);
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar4,std::flush<char,std::char_traits<char>>);
  }
  Am_Value_List::Start((Am_Value_List *)&this_cmd);
  do {
    bVar1 = Am_Value_List::Last((Am_Value_List *)&this_cmd);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      pAVar5 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)&menu);
      Am_Object::Set(&local_60,0x169,pAVar5,0);
      Am_Value_List::~Am_Value_List((Am_Value_List *)local_a8);
      Am_Value::~Am_Value((Am_Value *)&obj_mod_list.item);
      Am_Object::~Am_Object((Am_Object *)&obj_mod_val.value);
      Am_Object::~Am_Object(&real_cmd);
      Am_Value_List::~Am_Value_List((Am_Value_List *)&this_cmd);
      Am_Object::~Am_Object(&local_60);
      Am_Value_List::~Am_Value_List((Am_Value_List *)&menu);
      Am_Value_List::~Am_Value_List((Am_Value_List *)local_20);
      return;
    }
    pAVar2 = Am_Value_List::Get((Am_Value_List *)&this_cmd);
    Am_Object::operator=(&real_cmd,pAVar2);
    pAVar2 = Am_Object::Get(&real_cmd,0x153,0);
    Am_Object::operator=((Am_Object *)&obj_mod_val.value,pAVar2);
    pAVar2 = Am_Object::Get((Am_Object *)&obj_mod_val.value,0x16d,0);
    Am_Value::operator=((Am_Value *)&obj_mod_list.item,pAVar2);
    if ((am_sdebug & 1U) != 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"  for cmd ");
      poVar3 = operator<<(poVar3,&real_cmd);
      poVar3 = std::operator<<(poVar3," real ");
      poVar3 = operator<<(poVar3,(Am_Object *)&obj_mod_val.value);
      poVar3 = std::operator<<(poVar3," obj mod ");
      poVar3 = operator<<(poVar3,(Am_Value *)&obj_mod_list.item);
      pvVar4 = (void *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(pvVar4,std::flush<char,std::char_traits<char>>);
    }
    bVar1 = Am_Value::Valid((Am_Value *)&obj_mod_list.item);
    if (bVar1) {
      if ((short)obj_mod_list.item == -0x5fff) {
        Am_Value_List::Make_Empty((Am_Value_List *)local_a8);
        Am_Value_List::Add((Am_Value_List *)local_a8,(Am_Value *)&obj_mod_list.item,Am_TAIL,true);
      }
      else {
        bVar1 = Am_Value_List::Test((Am_Value *)&obj_mod_list.item);
        if (!bVar1) {
          poVar3 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
          poVar3 = std::operator<<(poVar3,"Object Modified of ");
          poVar3 = operator<<(poVar3,&real_cmd);
          poVar3 = std::operator<<(poVar3," is not list or obj ");
          poVar3 = operator<<(poVar3,(Am_Value *)&obj_mod_list.item);
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          Am_Error();
        }
        Am_Value_List::operator=((Am_Value_List *)local_a8,(Am_Value *)&obj_mod_list.item);
      }
      bVar1 = any_list_member((Am_Value_List *)local_20,(Am_Value_List *)local_a8);
      if (bVar1) {
        pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_(&real_cmd);
        Am_Value_List::Add((Am_Value_List *)&menu,pAVar5,Am_TAIL,true);
      }
    }
    Am_Value_List::Next((Am_Value_List *)&this_cmd);
  } while( true );
}

Assistant:

Am_Define_Method(Am_Object_Method, void, do_find_command_for_selection,
                 (Am_Object cmd))
{
  Am_Value_List objects = cmd.Get_Object(Am_SAVED_OLD_OWNER)
                              .Get_Owner()
                              .Get_Object(Am_SELECTION_WIDGET)
                              .Get(Am_VALUE);
  Am_Value_List cmds_using_objects;
  Am_Object menu =
      cmd.Get_Object(Am_SAVED_OLD_OWNER).Get_Sibling(Am_UNDO_SCROLL_GROUP);
  Am_Value_List all_cmds = menu.Get(Am_ITEMS);
  Am_Object this_cmd, real_cmd;
  Am_Value obj_mod_val;
  Am_Value_List obj_mod_list;
  if (am_sdebug)
    std::cout << "selected " << objects << " all commands " << all_cmds
              << std::endl
              << std::flush;
  for (all_cmds.Start(); !all_cmds.Last(); all_cmds.Next()) {
    this_cmd = all_cmds.Get();
    real_cmd = this_cmd.Get(Am_ID);
    obj_mod_val = real_cmd.Get(Am_OBJECT_MODIFIED);
    if (am_sdebug)
      std::cout << "  for cmd " << this_cmd << " real " << real_cmd
                << " obj mod " << obj_mod_val << std::endl
                << std::flush;
    if (obj_mod_val.Valid()) {
      if (obj_mod_val.type == Am_OBJECT) {
        obj_mod_list.Make_Empty();
        obj_mod_list.Add(obj_mod_val);
      } else if (Am_Value_List::Test(obj_mod_val)) {
        obj_mod_list = obj_mod_val;
      } else
        Am_ERROR("Object Modified of " << this_cmd << " is not list or obj "
                                       << obj_mod_val);
      if (any_list_member(objects, obj_mod_list))
        cmds_using_objects.Add(this_cmd);
    }
  }
  menu.Set(Am_VALUE, cmds_using_objects);
}